

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparserutils.h
# Opt level: O0

bool lunasvg::parseNumber<float>(string_view *input,float *number)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  __type_conflict _Var4;
  bool local_52;
  bool local_51;
  bool local_49;
  bool local_41;
  float local_3c;
  int local_38;
  float divisor;
  int expsign;
  int sign;
  int exponent;
  float fraction;
  float integer;
  float maxValue;
  float *number_local;
  string_view *input_local;
  
  exponent = 0;
  sign = 0;
  expsign = 0;
  divisor = 1.4013e-45;
  local_38 = 1;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
  if ((bVar1) ||
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input), *pvVar2 != '+'))
  {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
    if ((!bVar1) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input), *pvVar2 == '-'
       )) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
      divisor = -NAN;
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
  if (!bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
    bVar1 = IS_NUM((int)*pvVar2);
    if ((bVar1) ||
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input), *pvVar2 == '.'
       )) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
      bVar1 = IS_NUM((int)*pvVar2);
      if (bVar1) {
        do {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
          exponent = (int)((float)exponent * 10.0 + (float)(*pvVar2 + -0x30));
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
          local_41 = false;
          if (!bVar1) {
            pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
            local_41 = IS_NUM((int)*pvVar2);
          }
        } while (local_41 != false);
      }
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
      if ((!bVar1) &&
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input),
         *pvVar2 == '.')) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
        if (bVar1) {
          return false;
        }
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
        bVar1 = IS_NUM((int)*pvVar2);
        if (!bVar1) {
          return false;
        }
        local_3c = 1.0;
        do {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
          sign = (int)((float)sign * 10.0 + (float)(*pvVar2 + -0x30));
          local_3c = local_3c * 10.0;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
          local_49 = false;
          if (!bVar1) {
            pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
            local_49 = IS_NUM((int)*pvVar2);
          }
        } while (local_49 != false);
        sign = (int)((float)sign / local_3c);
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(input);
      if (((1 < sVar3) &&
          (((pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](input,0),
            *pvVar2 == 'e' ||
            (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](input,0),
            *pvVar2 == 'E')) &&
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](input,1),
           *pvVar2 != 'x')))) &&
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](input,1),
         *pvVar2 != 'm')) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
        if ((bVar1) ||
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input),
           *pvVar2 != '+')) {
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
          if ((!bVar1) &&
             (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input),
             *pvVar2 == '-')) {
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
            local_38 = -1;
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
        }
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
        if (!bVar1) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
          bVar1 = IS_NUM((int)*pvVar2);
          if (bVar1) {
            do {
              pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
              expsign = expsign * 10 + *pvVar2 + -0x30;
              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
              bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
              local_51 = false;
              if (!bVar1) {
                pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
                local_51 = IS_NUM((int)*pvVar2);
              }
            } while (local_51 != false);
            goto LAB_00133d7f;
          }
        }
        return false;
      }
LAB_00133d7f:
      *number = (float)(int)divisor * ((float)exponent + (float)sign);
      if (expsign != 0) {
        _Var4 = std::pow<double,int>(10.0,local_38 * expsign);
        *number = (float)_Var4 * *number;
      }
      local_52 = false;
      if (-3.4028235e+38 <= *number) {
        local_52 = *number <= 3.4028235e+38;
      }
      return local_52;
    }
  }
  return false;
}

Assistant:

inline bool parseNumber(std::string_view& input, T& number)
{
    constexpr T maxValue = std::numeric_limits<T>::max();
    T integer = 0;
    T fraction = 0;
    int exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(!input.empty() && input.front() == '+') {
        input.remove_prefix(1);
    } else if(!input.empty() && input.front() == '-') {
        input.remove_prefix(1);
        sign = -1;
    }

    if(input.empty() || (!IS_NUM(input.front()) && input.front() != '.'))
        return false;
    if(IS_NUM(input.front())) {
        do {
            integer = static_cast<T>(10) * integer + (input.front() - '0');
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
    }

    if(!input.empty() && input.front() == '.') {
        input.remove_prefix(1);
        if(input.empty() || !IS_NUM(input.front()))
            return false;
        T divisor = static_cast<T>(1);
        do {
            fraction = static_cast<T>(10) * fraction + (input.front() - '0');
            divisor *= static_cast<T>(10);
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
        fraction /= divisor;
    }

    if(input.size() > 1 && (input[0] == 'e' || input[0] == 'E')
        && (input[1] != 'x' && input[1] != 'm'))
    {
        input.remove_prefix(1);
        if(!input.empty() && input.front() == '+')
            input.remove_prefix(1);
        else if(!input.empty() && input.front() == '-') {
            input.remove_prefix(1);
            expsign = -1;
        }

        if(input.empty() || !IS_NUM(input.front()))
            return false;
        do {
            exponent = 10 * exponent + (input.front() - '0');
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
    }

    number = sign * (integer + fraction);
    if(exponent)
        number *= static_cast<T>(std::pow(10.0, expsign * exponent));
    return number >= -maxValue && number <= maxValue;
}